

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O1

double Gudhi::Persistence_representations::compute_distance_of_landscapes
                 (Persistence_landscape *first,Persistence_landscape *second,double p)

{
  pointer ppVar1;
  double dVar2;
  double *pdVar3;
  Persistence_landscape *in_RCX;
  long lVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Persistence_landscape lan;
  Persistence_landscape local_78;
  Persistence_landscape local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  local_28;
  
  operation_on_pair_of_landscapes<std::minus<double>>
            (&local_78,(Persistence_representations *)first,second,in_RCX);
  Persistence_landscape::abs(&local_50,(int)&local_78);
  local_28.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_50.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_50.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_50.land.
       super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_50.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.land.
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_28);
  local_78.number_of_functions_for_vectorization = local_50.number_of_functions_for_vectorization;
  local_78.number_of_functions_for_projections_to_reals =
       local_50.number_of_functions_for_projections_to_reals;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_50.land);
  if (1.79769313486232e+308 <= p) {
    if (local_78.land.
        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.land.
        super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      ppVar1 = ((local_78.land.
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)((local_78.land.
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
      if (lVar4 == 0) {
        uVar5 = 0xffc00000;
        uVar6 = 0xc1dfffff;
      }
      else {
        lVar4 = lVar4 >> 4;
        pdVar3 = &ppVar1->second;
        uVar7 = 0xffc00000;
        uVar8 = 0xc1dfffff;
        do {
          dVar2 = *pdVar3;
          uVar5 = SUB84(dVar2,0);
          uVar6 = (int)((ulong)dVar2 >> 0x20);
          if (dVar2 <= (double)CONCAT44(uVar8,uVar7)) {
            uVar5 = uVar7;
            uVar6 = uVar8;
          }
          pdVar3 = pdVar3 + 2;
          lVar4 = lVar4 + -1;
          uVar7 = uVar5;
          uVar8 = uVar6;
        } while (lVar4 != 0);
      }
    }
  }
  else {
    if ((p != 1.0) || (NAN(p))) {
      dVar2 = Persistence_landscape::compute_integral_of_landscape(&local_78,p);
      uVar5 = SUB84(dVar2,0);
      uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    else {
      dVar2 = Persistence_landscape::compute_integral_of_landscape(&local_78);
      uVar5 = SUB84(dVar2,0);
      uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    dVar2 = pow((double)CONCAT44(uVar6,uVar5),1.0 / p);
    uVar5 = SUB84(dVar2,0);
    uVar6 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_78.land);
  return (double)CONCAT44(uVar6,uVar5);
}

Assistant:

double compute_distance_of_landscapes(const Persistence_landscape& first, const Persistence_landscape& second,
                                      double p) {
  bool dbg = false;
  // This is what we want to compute: (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p). We will do it one step at a
  // time:

  // first-second :
  Persistence_landscape lan = first - second;

  //| first-second |:
  lan = lan.abs();

  if (dbg) {
    std::clog << "Abs of difference ; " << lan << std::endl;
    getchar();
  }

  if (p < std::numeric_limits<double>::max()) {
    // \int_{- \infty}^{+\infty}| first-second |^p
    double result;
    if (p != 1) {
      if (dbg) std::clog << "Power != 1, compute integral to the power p\n";
      result = lan.compute_integral_of_landscape(p);
    } else {
      if (dbg) std::clog << "Power = 1, compute integral \n";
      result = lan.compute_integral_of_landscape();
    }
    // (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p)
    return pow(result, 1.0 / p);
  } else {
    // p == infty
    if (dbg) std::clog << "Power = infty, compute maximum \n";
    return lan.compute_maximum();
  }
}